

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int net_tcp_set_linger(NETSOCKET sock,int state)

{
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  linger linger_state;
  undefined1 local_2c [4];
  undefined4 local_28;
  int iStack_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  iStack_10 = (int)((ulong)in_RDI >> 0x20);
  local_c = in_ESI;
  if (-1 < in_RDI) {
    setsockopt(iStack_10,1,0xd,local_2c,8);
  }
  if (-1 < local_c) {
    setsockopt(local_c,1,0xd,local_2c,8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int net_tcp_set_linger(NETSOCKET sock, int state)
{
	struct linger linger_state;
	linger_state.l_onoff = state;
	linger_state.l_linger = 0;

	if(sock.ipv4sock >= 0)
	{
		/*	set linger	*/
		setsockopt(sock.ipv4sock, SOL_SOCKET, SO_LINGER, (const char*)&linger_state, sizeof(linger_state));
	}

	if(sock.ipv6sock >= 0)
	{
		/*	set linger	*/
		setsockopt(sock.ipv6sock, SOL_SOCKET, SO_LINGER, (const char*)&linger_state, sizeof(linger_state));
	}

	return 0;
}